

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::
ArrayBuilder<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
::~ArrayBuilder(ArrayBuilder<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                *this)

{
  Entry *pEVar1;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  *pRVar2;
  Entry *pEVar3;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (Entry *)0x0) {
    pRVar2 = this->pos;
    pEVar3 = this->endPtr;
    this->ptr = (Entry *)0x0;
    this->pos = (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                 *)0x0;
    this->endPtr = (Entry *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pEVar1,0x18,((long)pRVar2 - (long)pEVar1 >> 3) * -0x5555555555555555,
               ((long)pEVar3 - (long)pEVar1 >> 3) * -0x5555555555555555,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }